

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O3

void __thiscall
ktx::OptionsTranscodeTarget<true>::process
          (OptionsTranscodeTarget<true> *this,Options *param_1,ParseResult *args,Reporter *report)

{
  size_t sVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  int iVar5;
  OptionValue *pOVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  const_iterator cVar8;
  size_type sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  string argStr;
  undefined1 local_313;
  undefined1 local_312;
  undefined1 local_311;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  string local_2f0;
  Reporter *local_2d0;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2c8;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2c0;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2b8;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2b0;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2a8;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2a0;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_298;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_290;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_288;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_280;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_278;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_270;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_58;
  
  local_2d0 = report;
  if ((process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::targets_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)
                                      ::targets_abi_cxx11_), iVar5 != 0)) {
    local_2f0._M_dataplus._M_p = (pointer)0x0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[8],_true>
              (&local_260,(char (*) [8])"etc-rgb",
               (pair<ktx_transcode_fmt_e,_unsigned_int> *)&local_2f0);
    local_268.first = KTX_TTF_ETC2_RGBA;
    local_268.second = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[9],_true>(&local_238,(char (*) [9])"etc-rgba",&local_268);
    local_270.first = KTX_TTF_ETC2_EAC_R11;
    local_270.second = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[8],_true>(&local_210,(char (*) [8])"eac-r11",&local_270);
    local_278.first = KTX_TTF_ETC2_EAC_RG11;
    local_278.second = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[9],_true>(&local_1e8,(char (*) [9])"eac-rg11",&local_278);
    local_280.first = KTX_TF_BC1;
    local_280.second = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>(&local_1c0,(char (*) [4])"bc1",&local_280);
    local_288.first = KTX_TF_BC3;
    local_288.second = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>(&local_198,(char (*) [4])"bc3",&local_288);
    local_290.first = KTX_TF_BC4;
    local_290.second = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>(&local_170,(char (*) [4])"bc4",&local_290);
    local_298.first = KTX_TF_BC5;
    local_298.second = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>(&local_148,(char (*) [4])"bc5",&local_298);
    local_2a0.first = KTX_TF_BC7_M6_OPAQUE_ONLY;
    local_2a0.second = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>(&local_120,(char (*) [4])"bc7",&local_2a0);
    local_2a8.first = KTX_TTF_ASTC_4x4_RGBA;
    local_2a8.second = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[5],_true>(&local_f8,(char (*) [5])0x204006,&local_2a8);
    local_2b0.first = KTX_TTF_RGBA32;
    local_2b0.second = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[3],_true>(&local_d0,(char (*) [3])"r8",&local_2b0);
    local_2b8.first = KTX_TTF_RGBA32;
    local_2b8.second = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>(&local_a8,(char (*) [4])"rg8",&local_2b8);
    local_2c0.first = KTX_TTF_RGBA32;
    local_2c0.second = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[5],_true>(&local_80,(char (*) [5])"rgb8",&local_2c0);
    local_2c8.first = KTX_TTF_RGBA32;
    local_2c8.second = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[6],_true>(&local_58,(char (*) [6])"rgba8",&local_2c8);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<ktx_transcode_fmt_e,unsigned_int>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<ktx_transcode_fmt_e,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _Hashtable<std::pair<std::__cxx11::string_const,std::pair<ktx_transcode_fmt_e,unsigned_int>>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<ktx_transcode_fmt_e,unsigned_int>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<ktx_transcode_fmt_e,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                   targets_abi_cxx11_,&local_260,&stack0xffffffffffffffd0,0,&local_311,&local_312,
               &local_313);
    lVar11 = -0x230;
    paVar10 = &local_58.first.field_2;
    do {
      if (paVar10 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar10->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar10->_M_allocated_capacity)[-2],
                        paVar10->_M_allocated_capacity + 1);
      }
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar10->_M_allocated_capacity + -5);
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>_>
                 ::~unordered_map,
                 &process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                  targets_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                         targets_abi_cxx11_);
  }
  paVar10 = &local_260.first.field_2;
  local_260.first._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"target","");
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_260.first);
  sVar1 = pOVar6->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.first._M_dataplus._M_p != paVar10) {
    operator_delete(local_260.first._M_dataplus._M_p,
                    local_260.first.field_2._M_allocated_capacity + 1);
  }
  if (sVar1 != 0) {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"target","");
    pOVar6 = cxxopts::ParseResult::operator[](args,&local_2f0);
    pbVar7 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar6);
    pcVar2 = (pbVar7->_M_dataplus)._M_p;
    local_310 = &local_300;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310,pcVar2,pcVar2 + pbVar7->_M_string_length);
    sVar4 = local_308;
    paVar3 = local_310;
    if (local_308 != 0) {
      sVar9 = 0;
      do {
        iVar5 = tolower((int)paVar3->_M_local_buf[sVar9]);
        paVar3->_M_local_buf[sVar9] = (char)iVar5;
        sVar9 = sVar9 + 1;
      } while (sVar4 != sVar9);
    }
    local_260.first._M_dataplus._M_p = (pointer)local_310;
    if (local_310 == &local_300) {
      local_260.first.field_2._8_8_ = local_300._8_8_;
      local_260.first._M_dataplus._M_p = (pointer)paVar10;
    }
    local_260.first.field_2._M_allocated_capacity._1_7_ = local_300._M_allocated_capacity._1_7_;
    local_260.first.field_2._M_local_buf[0] = local_300._M_local_buf[0];
    local_260.first._M_string_length = local_308;
    local_308 = 0;
    local_300._M_local_buf[0] = '\0';
    local_310 = &local_300;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    cVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                    targets_abi_cxx11_._M_h,&local_260.first);
    if (cVar8.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      Reporter::fatal_usage<char_const(&)[32],std::__cxx11::string_const&>
                (local_2d0,(char (*) [32])"Invalid transcode target: \"{}\".",&local_260.first);
    }
    (this->transcodeTarget).super__Optional_base<ktx_transcode_fmt_e,_true,_true>._M_payload.
    super__Optional_payload_base<ktx_transcode_fmt_e> =
         (_Optional_payload_base<ktx_transcode_fmt_e>)
         ((ulong)*(uint *)((long)cVar8.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_true>
                                 ._M_cur + 0x28) | 0x100000000);
    std::__cxx11::string::_M_assign((string *)&this->transcodeTargetName);
    this->transcodeSwizzleComponents =
         *(uint32_t *)
          ((long)cVar8.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_true>
                 ._M_cur + 0x2c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.first._M_dataplus._M_p != paVar10) {
      operator_delete(local_260.first._M_dataplus._M_p,
                      local_260.first.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        // "transcode" command - optional "target" argument
        // "extract" command - optional "transcode" argument
        const auto argName = TRANSCODE_CMD ? "target" : "transcode";

        static const std::unordered_map<std::string, std::pair<ktx_transcode_fmt_e, uint32_t>> targets{
            {"etc-rgb", {KTX_TTF_ETC1_RGB, 0}},
            {"etc-rgba", {KTX_TTF_ETC2_RGBA, 0}},
            {"eac-r11", {KTX_TTF_ETC2_EAC_R11, 0}},
            {"eac-rg11", {KTX_TTF_ETC2_EAC_RG11, 0}},
            {"bc1", {KTX_TTF_BC1_RGB, 0}},
            {"bc3", {KTX_TTF_BC3_RGBA, 0}},
            {"bc4", {KTX_TTF_BC4_R, 0}},
            {"bc5", {KTX_TTF_BC5_RG, 0}},
            {"bc7", {KTX_TTF_BC7_RGBA, 0}},
            {"astc", {KTX_TTF_ASTC_4x4_RGBA, 0}},
            {"r8", {KTX_TTF_RGBA32, 1}},
            {"rg8", {KTX_TTF_RGBA32, 2}},
            {"rgb8", {KTX_TTF_RGBA32, 3}},
            {"rgba8", {KTX_TTF_RGBA32, 4}},
        };
        if (args[argName].count()) {
            const auto argStr = to_lower_copy(args[argName].as<std::string>());
            const auto it = targets.find(argStr);
            if (it == targets.end())
                report.fatal_usage("Invalid transcode target: \"{}\".", argStr);

            transcodeTarget = it->second.first;
            transcodeTargetName = argStr;
            transcodeSwizzleComponents = it->second.second;
        }
    }